

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# countdown_latch_test.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::tools::CountdownLatchTest_TestCountdownLatchFromZeroDefiniteAwait_Test::TestBody
          (CountdownLatchTest_TestCountdownLatchFromZeroDefiniteAwait_Test *this)

{
  byte bVar1;
  bool bVar2;
  char *pcVar3;
  char *in_R9;
  AssertHelper local_130;
  Message local_128;
  int local_11c;
  duration<long,_std::ratio<1L,_1000L>_> local_118;
  duration<long,_std::ratio<1L,_1000000000L>_> local_110;
  duration<long,_std::ratio<1L,_1000000000L>_> local_108;
  duration<long,_std::ratio<1L,_1000000000L>_> local_100;
  undefined1 local_f8 [8];
  AssertionResult gtest_ar;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  end;
  AssertHelper local_c0;
  Message local_b8 [3];
  int local_9c;
  undefined8 local_98;
  bool local_89;
  undefined1 local_88 [8];
  AssertionResult gtest_ar_;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  start;
  CountdownLatch latch;
  CountdownLatchTest_TestCountdownLatchFromZeroDefiniteAwait_Test *this_local;
  
  bidfx_public_api::tools::CountdownLatch::CountdownLatch((CountdownLatch *)&start,0);
  gtest_ar_.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::chrono::_V2::system_clock::now();
  local_9c = 10000;
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1000l>> *)&local_98,&local_9c);
  bVar1 = bidfx_public_api::tools::CountdownLatch::Await(&start,local_98);
  local_89 = (bool)(bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_88,&local_89,(type *)0x0)
  ;
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
  if (!bVar2) {
    testing::Message::Message(local_b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&end,(internal *)local_88,
               (AssertionResult *)"latch.Await(std::chrono::milliseconds(10000))","false","true",
               in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/countdown_latch_test.cpp"
               ,0x60,pcVar3);
    testing::internal::AssertHelper::operator=(&local_c0,local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    std::__cxx11::string::~string((string *)&end);
    testing::Message::~Message(local_b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
  gtest_ar.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::chrono::_V2::system_clock::now();
  local_108.__r =
       (rep)std::chrono::
            time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
            ::time_since_epoch((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                *)&gtest_ar.message_);
  local_110.__r =
       (rep)std::chrono::
            time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
            ::time_since_epoch((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                *)&gtest_ar_.message_);
  local_100.__r = (rep)std::chrono::operator-(&local_108,&local_110);
  local_11c = 10000;
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1000l>> *)&local_118,&local_11c);
  testing::internal::
  CmpHelperLT<std::chrono::duration<long,std::ratio<1l,1000000000l>>,std::chrono::duration<long,std::ratio<1l,1000l>>>
            ((internal *)local_f8,"end.time_since_epoch() - start.time_since_epoch()",
             "std::chrono::milliseconds(10000)",&local_100,&local_118);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f8);
  if (!bVar2) {
    testing::Message::Message(&local_128);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_f8);
    testing::internal::AssertHelper::AssertHelper
              (&local_130,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/countdown_latch_test.cpp"
               ,0x62,pcVar3);
    testing::internal::AssertHelper::operator=(&local_130,&local_128);
    testing::internal::AssertHelper::~AssertHelper(&local_130);
    testing::Message::~Message(&local_128);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f8);
  CountdownLatch::~CountdownLatch((CountdownLatch *)&start);
  return;
}

Assistant:

TEST(CountdownLatchTest, TestCountdownLatchFromZeroDefiniteAwait)
{
    CountdownLatch latch = CountdownLatch(0);
    std::chrono::time_point<std::chrono::system_clock> start  = std::chrono::system_clock::now();
    EXPECT_TRUE(latch.Await(std::chrono::milliseconds(10000)));
    std::chrono::time_point<std::chrono::system_clock> end = std::chrono::system_clock::now();
    EXPECT_LT(end.time_since_epoch() - start.time_since_epoch(), std::chrono::milliseconds(10000));
}